

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O1

void __thiscall
QFileSystemModelPrivate::addVisibleFiles
          (QFileSystemModelPrivate *this,QFileSystemNode *parentNode,QStringList *newFiles)

{
  QModelIndex *pQVar1;
  Node<QString,_QFileSystemModelPrivate::QFileSystemNode_*> *pNVar2;
  long lVar3;
  QString *newFile;
  QString *args;
  long in_FS_OFFSET;
  bool bVar4;
  undefined1 local_58 [16];
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QModelIndex **)&this->field_0x8;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  bVar4 = false;
  index((QFileSystemModelPrivate *)local_58,(char *)this,(int)parentNode);
  if (((&this->root != parentNode) && (bVar4 = true, -1 < (int)local_58._0_4_)) &&
     (-1 < (long)local_58._0_8_)) {
    bVar4 = local_48 == (undefined1 *)0x0;
  }
  if (!bVar4) {
    QAbstractItemModel::beginInsertRows
              (pQVar1,(int)local_58,(int)(parentNode->visibleChildren).d.size);
  }
  if (parentNode->dirtyChildrenIndex == -1) {
    parentNode->dirtyChildrenIndex = (int)(parentNode->visibleChildren).d.size;
  }
  lVar3 = (newFiles->d).size;
  if (lVar3 != 0) {
    args = (newFiles->d).ptr;
    lVar3 = lVar3 * 0x18;
    do {
      QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                ((QMovableArrayOps<QString> *)&parentNode->visibleChildren,
                 (parentNode->visibleChildren).d.size,args);
      QList<QString>::end(&parentNode->visibleChildren);
      pNVar2 = QHashPrivate::
               Data<QHashPrivate::Node<QString,_QFileSystemModelPrivate::QFileSystemNode_*>_>::
               findNode<QString>((parentNode->children).d,args);
      pNVar2->value->isVisible = true;
      args = args + 1;
      lVar3 = lVar3 + -0x18;
    } while (lVar3 != 0);
  }
  if (!bVar4) {
    QAbstractItemModel::endInsertRows();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileSystemModelPrivate::addVisibleFiles(QFileSystemNode *parentNode, const QStringList &newFiles)
{
    Q_Q(QFileSystemModel);
    QModelIndex parent = index(parentNode);
    bool indexHidden = isHiddenByFilter(parentNode, parent);
    if (!indexHidden) {
        q->beginInsertRows(parent, parentNode->visibleChildren.size() , parentNode->visibleChildren.size() + newFiles.size() - 1);
    }

    if (parentNode->dirtyChildrenIndex == -1)
        parentNode->dirtyChildrenIndex = parentNode->visibleChildren.size();

    for (const auto &newFile : newFiles) {
        parentNode->visibleChildren.append(newFile);
        parentNode->children.value(newFile)->isVisible = true;
    }
    if (!indexHidden)
      q->endInsertRows();
}